

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O1

int find_real_roots_sturm(double *p,int order,double *roots,int *nroots,int maxpow,bool non_neg)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  int atmax;
  int atmin;
  poly sseq [65];
  int local_8670;
  int local_866c;
  double local_8668;
  int *local_8660;
  double local_8658;
  double local_8650;
  poly local_8648 [65];
  
  dVar11 = 1.0;
  if (-1 < order) {
    dVar10 = p[order];
    uVar6 = 0;
    do {
      local_8648[0].coef[uVar6] = p[uVar6] * (1.0 / dVar10);
      uVar6 = uVar6 + 1;
    } while (order + 1 != uVar6);
  }
  local_8660 = nroots;
  if ((10.0 < ABS(local_8648[0].coef[0])) &&
     (dVar11 = pow(ABS(local_8648[0].coef[0]),-1.0 / (double)order), 0 < order)) {
    lVar5 = (ulong)(uint)order + 1;
    dVar10 = dVar11;
    do {
      local_8648[0].coef[lVar5 + -2] = dVar10 * local_8648[0].coef[lVar5 + -2];
      lVar5 = lVar5 + -1;
      dVar10 = dVar11 * dVar10;
    } while (1 < lVar5);
  }
  local_8650 = dVar11;
  iVar2 = buildsturm(order,local_8648);
  iVar3 = numroots(iVar2,local_8648,&local_866c,&local_8670,non_neg);
  *local_8660 = iVar3;
  if (iVar3 == 0) {
    iVar2 = 0;
  }
  else {
    local_8668 = 0.0;
    if (!non_neg) {
      local_8668 = -1.0;
      iVar4 = numchanges(iVar2,local_8648,-1.0);
      iVar3 = local_866c;
      bVar9 = iVar4 != local_866c;
      if (maxpow != 0 && bVar9) {
        iVar7 = maxpow + -1;
        local_8668 = -1.0;
        do {
          local_8668 = local_8668 * 10.0;
          iVar4 = numchanges(iVar2,local_8648,local_8668);
          bVar8 = iVar7 != 0;
          iVar7 = iVar7 + -1;
          bVar9 = iVar4 != iVar3;
          if (iVar4 == iVar3) break;
        } while (bVar8);
      }
      if (bVar9) {
        local_866c = iVar4;
      }
    }
    iVar4 = numchanges(iVar2,local_8648,1.0);
    iVar3 = local_8670;
    bVar9 = iVar4 != local_8670;
    dVar11 = 1.0;
    if (maxpow != 0 && bVar9) {
      iVar7 = maxpow + -1;
      local_8658 = 1.0;
      do {
        local_8658 = local_8658 * 10.0;
        iVar4 = numchanges(iVar2,local_8648,local_8658);
        bVar8 = iVar7 != 0;
        iVar7 = iVar7 + -1;
        bVar9 = iVar4 != iVar3;
        dVar11 = local_8658;
        if (iVar4 == iVar3) break;
      } while (bVar8);
    }
    piVar1 = local_8660;
    if (bVar9) {
      local_8670 = iVar4;
    }
    *local_8660 = local_866c - local_8670;
    sbisect(iVar2,local_8648,local_8668,dVar11,local_866c,local_8670,roots);
    iVar3 = *piVar1;
    iVar2 = 1;
    if (0 < (long)iVar3) {
      lVar5 = 0;
      do {
        roots[lVar5] = roots[lVar5] / local_8650;
        lVar5 = lVar5 + 1;
      } while (iVar3 != lVar5);
    }
  }
  return iVar2;
}

Assistant:

int find_real_roots_sturm( 
	double *p, int order, double *roots, int *nroots, int maxpow, bool non_neg)
   {
   /*
    * finds the roots of the input polynomial.  They are returned in roots.
    * It is assumed that roots is already allocated with space for the roots.
    */

   poly sseq[Maxdegree+1];
   double  min, max;
   int  i, nchanges, np, atmin, atmax;

   // Copy the coefficients from the input p.  Normalize as we go
   double norm = 1.0 / p[order];
   for (i=0; i<=order; i++)
      sseq[0].coef[i] =  p[i] * norm;

   // Now, also normalize the other terms
   double val0 = fabs(sseq[0].coef[0]);
   double fac = 1.0; // This will be a factor for the roots
   if (val0 > 10.0)  // Do this in case there are zero roots
      {
      fac = pow(val0, -1.0/order);
      double mult = fac;
      for (int i=order-1; i>=0; i--)
         {
         sseq[0].coef[i] *= mult;
         mult = mult * fac; 
         }
      }

   /* build the Sturm sequence */
   np = buildsturm(order, sseq);

#ifdef RH_DEBUG
   {
   int i, j;

   printf("Sturm sequence for:\n");
   for (i=order; i>=0; i--)
      printf("%lf ", sseq[0].coef[i]);
   printf("\n\n");

   for (i = 0; i <= np; i++) {
      for (j = sseq[i].ord; j >= 0; j--)
         printf("%10f ", sseq[i].coef[j]);
      printf("\n");
      }

   printf("\n");
   }
#endif

   // get the number of real roots
   *nroots = numroots(np, sseq, &atmin, &atmax, non_neg);

   if (*nroots == 0) {
      // fprintf(stderr, "solve: no real roots\n");
      return 0 ;
      }

   /* calculate the bracket that the roots live in */
   if (non_neg) min = 0.0;
   else
      {
      min = -1.0;
      nchanges = numchanges(np, sseq, min);
      for (i = 0; nchanges != atmin && i != maxpow; i++) { 
         min *= 10.0;
         nchanges = numchanges(np, sseq, min);
         }

      if (nchanges != atmin) {
         //printf("solve: unable to bracket all negative roots\n");
         atmin = nchanges;
         }
      }

   max = 1.0;
   nchanges = numchanges(np, sseq, max);
   for (i = 0; nchanges != atmax && i != maxpow; i++) { 
      max *= 10.0;
      nchanges = numchanges(np, sseq, max);
      }

   if (nchanges != atmax) {
      //printf("solve: unable to bracket all positive roots\n");
      atmax = nchanges;
      }

   *nroots = atmin - atmax;

   /* perform the bisection */
   sbisect(np, sseq, min, max, atmin, atmax, roots);

   /* Finally, reorder the roots */
   for (i=0; i<*nroots; i++)
      roots[i] /= fac;

#ifdef RH_DEBUG

   /* write out the roots */
   printf("Number of roots = %d\n", *nroots);
   for (i=0; i<*nroots; i++)
      printf("%12.5e\n", roots[i]);

#endif

   return 1; 
   }